

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

void __thiscall
btAlignedObjectArray<btAlignedObjectArray<int>_>::btAlignedObjectArray
          (btAlignedObjectArray<btAlignedObjectArray<int>_> *this,
          btAlignedObjectArray<btAlignedObjectArray<int>_> *otherArray)

{
  btAlignedObjectArray<btAlignedObjectArray<int>_> *in_RSI;
  btAlignedObjectArray<btAlignedObjectArray<int>_> *in_RDI;
  int otherSize;
  btAlignedObjectArray<int> *fillData;
  int in_stack_ffffffffffffffbc;
  btAlignedObjectArray<btAlignedObjectArray<int>_> *in_stack_ffffffffffffffc0;
  btAlignedObjectArray<int> local_38;
  uint local_14;
  btAlignedObjectArray<btAlignedObjectArray<int>_> *local_10;
  
  local_10 = in_RSI;
  btAlignedAllocator<btAlignedObjectArray<int>,_16U>::btAlignedAllocator
            ((btAlignedAllocator<btAlignedObjectArray<int>,_16U> *)in_RDI);
  init(in_RDI,(EVP_PKEY_CTX *)in_RSI);
  local_14 = size(local_10);
  fillData = &local_38;
  btAlignedObjectArray<int>::btAlignedObjectArray((btAlignedObjectArray<int> *)in_RDI);
  resize(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,fillData);
  btAlignedObjectArray<int>::~btAlignedObjectArray((btAlignedObjectArray<int> *)0x26463b);
  copy(local_10,(EVP_PKEY_CTX *)0x0,(EVP_PKEY_CTX *)(ulong)local_14);
  return;
}

Assistant:

btAlignedObjectArray(const btAlignedObjectArray& otherArray)
		{
			init();

			int otherSize = otherArray.size();
			resize (otherSize);
			otherArray.copy(0, otherSize, m_data);
		}